

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O0

size_t ZSTD_decodingBufferSize_min
                 (unsigned_long_long windowSize,unsigned_long_long frameContentSize)

{
  ulong local_50;
  unsigned_long_long local_48;
  size_t minRBSize;
  unsigned_long_long neededSize;
  unsigned_long_long neededRBSize;
  size_t blockSize;
  unsigned_long_long frameContentSize_local;
  unsigned_long_long windowSize_local;
  
  local_48 = windowSize;
  if (0x1ffff < windowSize) {
    local_48 = 0x20000;
  }
  local_50 = windowSize + local_48 + 0x20040;
  if (frameContentSize < local_50) {
    local_50 = frameContentSize;
  }
  return local_50;
}

Assistant:

size_t ZSTD_decodingBufferSize_min(unsigned long long windowSize, unsigned long long frameContentSize)
{
    size_t const blockSize = (size_t) MIN(windowSize, ZSTD_BLOCKSIZE_MAX);
    /* space is needed to store the litbuffer after the output of a given block without stomping the extDict of a previous run, as well as to cover both windows against wildcopy*/
    unsigned long long const neededRBSize = windowSize + blockSize + ZSTD_BLOCKSIZE_MAX + (WILDCOPY_OVERLENGTH * 2);
    unsigned long long const neededSize = MIN(frameContentSize, neededRBSize);
    size_t const minRBSize = (size_t) neededSize;
    RETURN_ERROR_IF((unsigned long long)minRBSize != neededSize,
                    frameParameter_windowTooLarge, "");
    return minRBSize;
}